

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
common_tokenize(vector<int,_std::allocator<int>_> *__return_storage_ptr__,llama_vocab *vocab,
               string *text,bool add_special,bool parse_special)

{
  pointer piVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  allocator_type local_31;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)((int)CONCAT71(in_register_00000009,add_special) * 2 +
                   (int)text->_M_string_length),&local_31);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = llama_tokenize(vocab,(text->_M_dataplus)._M_p,(int)text->_M_string_length,piVar1,
                         (ulong)((long)(__return_storage_ptr__->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar1) >> 2,
                         CONCAT71(in_register_00000009,add_special) & 0xffffffff,
                         (int)CONCAT71(in_register_00000081,parse_special));
  if ((int)uVar2 < 0) {
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(ulong)-uVar2);
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = llama_tokenize(vocab,(text->_M_dataplus)._M_p,(int)text->_M_string_length,piVar1,
                           (ulong)((long)(__return_storage_ptr__->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar1) >> 2,
                           add_special,parse_special);
    if (uVar3 != -uVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                 ,0x4ea,"GGML_ASSERT(%s) failed","check == -n_tokens");
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(ulong)uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<llama_token> common_tokenize(
    const struct llama_vocab * vocab,
           const std::string & text,
                        bool   add_special,
                        bool   parse_special) {
    // upper limit for the number of tokens
    int n_tokens = text.length() + 2 * add_special;
    std::vector<llama_token> result(n_tokens);
    n_tokens = llama_tokenize(vocab, text.data(), text.length(), result.data(), result.size(), add_special, parse_special);
    if (n_tokens < 0) {
        result.resize(-n_tokens);
        int check = llama_tokenize(vocab, text.data(), text.length(), result.data(), result.size(), add_special, parse_special);
        GGML_ASSERT(check == -n_tokens);
    } else {
        result.resize(n_tokens);
    }
    return result;
}